

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O2

bool __thiscall
nuraft::FakeNetwork::makeReqFail(FakeNetwork *this,string *endpoint,bool random_order)

{
  _List_node_base *p_Var1;
  const_iterator __position;
  SimpleLogger *this_00;
  pointer pcVar2;
  pointer pcVar3;
  msg_type type;
  list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_> *plVar4;
  ptr<FakeClient> pVar5;
  ptr<resp_msg> rsp;
  ptr<rpc_exception> exp;
  ptr<FakeClient> conn;
  undefined1 local_a8 [8];
  strfmt<100> local_a0;
  
  pVar5 = findClient((FakeNetwork *)&conn,(string *)this);
  __position._M_node =
       ((conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       pendingReqs).
       super__List_base<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  plVar4 = &(conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pendingReqs;
  if (__position._M_node != (_List_node_base *)plVar4) {
    p_Var1 = __position._M_node + 1;
    this_00 = ((this->base).super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->myLog;
    if ((this_00 != (SimpleLogger *)0x0) &&
       (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
      pcVar2 = (this->myEndpoint)._M_dataplus._M_p;
      pcVar3 = (endpoint->_M_dataplus)._M_p;
      msg_type_to_string_abi_cxx11_
                ((string *)(local_a8 + 8),(nuraft *)(ulong)*(uint *)&p_Var1->_M_next[1]._M_next,
                 (msg_type)
                 pVar5.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      SimpleLogger::put(this_00,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                        ,"makeReqFail",0xc6,"[BEGIN] make request %s -> %s failed, %s",pcVar2,pcVar3
                        ,local_a0.buf_._0_8_);
      std::__cxx11::string::~string((string *)(local_a8 + 8));
    }
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.fmt_ = "failed to send request to peer %d";
    local_a8 = (undefined1  [8])
               strfmt<100>::fmt<int>
                         ((strfmt<100> *)(local_a8 + 8),*(int *)&p_Var1->_M_next[1]._M_prev);
    std::make_shared<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)&exp,(shared_ptr<nuraft::req_msg> *)local_a8);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)(__position._M_node + 2),&rsp,&exp);
    if ((this_00 != (SimpleLogger *)0x0) &&
       (3 < (this_00->curLogLevel).super___atomic_base<int>._M_i)) {
      pcVar2 = (this->myEndpoint)._M_dataplus._M_p;
      pcVar3 = (endpoint->_M_dataplus)._M_p;
      msg_type_to_string_abi_cxx11_
                ((string *)(local_a8 + 8),(nuraft *)(ulong)*(uint *)&p_Var1->_M_next[1]._M_next,type
                );
      SimpleLogger::put(this_00,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/fake_network.cxx"
                        ,"makeReqFail",0xd2,"[END] make request %s -> %s failed, %s",pcVar2,pcVar3,
                        local_a0.buf_._0_8_);
      std::__cxx11::string::~string((string *)(local_a8 + 8));
    }
    std::__cxx11::list<nuraft::FakeNetwork::ReqPkg,_std::allocator<nuraft::FakeNetwork::ReqPkg>_>::
    erase(&(conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pendingReqs,__position);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&exp.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&conn.super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __position._M_node != (_List_node_base *)plVar4;
}

Assistant:

bool FakeNetwork::makeReqFail(const std::string& endpoint,
                              bool random_order)
{
    // this:                    source (sending request)
    // conn->dstNet (endpoint): destination (sending response)
    ptr<FakeClient> conn = findClient(endpoint);

    auto pkg_entry = conn->pendingReqs.begin();
    if (pkg_entry == conn->pendingReqs.end()) return false;

    ReqPkg& pkg = *pkg_entry;

    SimpleLogger* ll = base->getLogger();
    _log_info(ll, "[BEGIN] make request %s -> %s failed, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    ptr<resp_msg> rsp; // empty.
    ptr<rpc_exception> exp
        ( cs_new<rpc_exception>
          ( sstrfmt( "failed to send request to peer %d" )
                   .fmt( pkg.req->get_dst() ),
            pkg.req ) );
    pkg.whenDone( rsp, exp );

    _log_info(ll, "[END] make request %s -> %s failed, %s",
              myEndpoint.c_str(), endpoint.c_str(),
              msg_type_to_string( pkg.req->get_type() ).c_str() );

    conn->pendingReqs.erase(pkg_entry);
    return true;
}